

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall
ktx::ValidationContext::error<std::__cxx11::string>
          (ValidationContext *this,IssueError *issue,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args_00;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  pointer local_38;
  size_type sStack_30;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_80[0] = (issue->super_Issue).type;
  local_80._2_2_ = (issue->super_Issue).id;
  pcVar1 = (issue->super_Issue).message._M_str;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
  local_38 = (args->_M_dataplus)._M_p;
  sStack_30 = args->_M_string_length;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)&local_38;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_58,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }